

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceTest_TestEmptyStringMapEntriesPopulatedInReflection_Test::
~NoFieldPresenceTest_TestEmptyStringMapEntriesPopulatedInReflection_Test
          (NoFieldPresenceTest_TestEmptyStringMapEntriesPopulatedInReflection_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, TestEmptyStringMapEntriesPopulatedInReflection) {
  // For map entries, test that you can set and read zero values.
  // Importantly this means that proto3 map fields behave like explicit
  // presence in reflection! i.e. they can be accessed even when zeroed.

  TestAllMapTypes message;
  const Reflection* r = message.GetReflection();
  const Descriptor* desc = message.GetDescriptor();

  const FieldDescriptor* field_map_int32_bytes =
      desc->FindFieldByName("map_int32_bytes");

  // Set zero values for zero keys and test that.
  (*message.mutable_map_int32_bytes())[0];

  // These map entries are considered valid in reflection APIs.
  EXPECT_EQ(1, r->FieldSize(message, field_map_int32_bytes));
  const google::protobuf::Message& bytes_map_entry =
      r->GetRepeatedMessage(message, field_map_int32_bytes, /*index=*/0);

  // If map entries are truly "no presence", then they should not return true
  // for HasField!
  // However, the existing behavior is that map entries behave like
  // explicit-presence fields in reflection -- i.e. they must return true for
  // HasField even though they are zero.
  EXPECT_THAT(bytes_map_entry, MapEntryHasKey());
  EXPECT_THAT(bytes_map_entry, MapEntryHasValue());
  EXPECT_THAT(bytes_map_entry, MapEntryListFieldsSize(2));
}